

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O3

void * __thiscall mpt::array::insert(array *this,size_t off,size_t len,void *data)

{
  content *pcVar1;
  uint uVar2;
  long lVar3;
  long *plVar4;
  void *pvVar5;
  
  pcVar1 = (this->_buf)._ref;
  if ((pcVar1 != (content *)0x0) && (*(long *)(pcVar1 + 8) == 0)) {
    uVar2 = (*(code *)**(undefined8 **)pcVar1)(pcVar1);
    if ((uVar2 >> 8 & 1) == 0) {
      lVar3 = mpt_buffer_insert(pcVar1,off,len);
      if (lVar3 != 0) goto LAB_001291cb;
    }
  }
  plVar4 = (long *)_mpt_buffer_alloc(len + off,0);
  if (plVar4 != (long *)0x0) {
    plVar4[1] = 0;
    lVar3 = mpt_buffer_insert(plVar4,off,len);
    if (lVar3 != 0) {
LAB_001291cb:
      if (data != (void *)0x0) {
        pvVar5 = memcpy((void *)(lVar3 + off),data,len);
        return pvVar5;
      }
      pvVar5 = memset((void *)(lVar3 + off),0,len);
      return pvVar5;
    }
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  return (void *)0x0;
}

Assistant:

void *array::insert(size_t off, size_t len, const void *data)
{
	void *dest = 0;
	content *d;
	
	/* compatibility check */
	if ((d = _buf.instance())
	 && !d->content_traits()
	 && !d->shared()) {
		dest = d->insert(off, len);
	}
	if (!dest) {
		size_t total = off + len;
		if (!(d = static_cast<content *>(buffer::create(total)))) {
			return 0;
		}
		if (!(dest = d->insert(off, len))) {
			d->unref();
			return 0;
		}
	}
	dest = static_cast<uint8_t *>(dest) + off;
	if (data) {
		memcpy(dest, data, len);
	} else {
		memset(dest, 0, len);
	}
	return dest;
}